

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQUserPointer sq_newuserdata(HSQUIRRELVM v,SQUnsignedInteger size)

{
  SQCollectable *in_RDI;
  SQUserData *ud;
  SQInteger in_stack_ffffffffffffffb8;
  SQSharedState *in_stack_ffffffffffffffc0;
  SQVM *this;
  SQUserData *local_18;
  SQCollectable *local_8;
  
  local_8 = in_RDI;
  local_18 = SQUserData::Create(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this = (SQVM *)&stack0xffffffffffffffd8;
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)this,local_18);
  SQVM::Push(this,(SQObjectPtr *)local_8);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
  return (SQUserPointer)
         ((ulong)((long)&local_18[1].super_SQDelegable.super_SQCollectable.super_SQRefCounted.
                         _vptr_SQRefCounted + 7) & 0xfffffffffffffff8);
}

Assistant:

SQUserPointer sq_newuserdata(HSQUIRRELVM v,SQUnsignedInteger size)
{
    SQUserData *ud = SQUserData::Create(_ss(v), size + SQ_ALIGNMENT);
    v->Push(ud);
    return (SQUserPointer)sq_aligning(ud + 1);
}